

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermediate.h
# Opt level: O1

void __thiscall
glslang::TIntermTraverser::incrementDepth(TIntermTraverser *this,TIntermNode *current)

{
  pointer *pppTVar1;
  int iVar2;
  iterator __position;
  int iVar3;
  TIntermNode *local_8;
  
  iVar2 = this->depth;
  iVar3 = iVar2 + 1;
  this->depth = iVar3;
  if (iVar2 < this->maxDepth) {
    iVar3 = this->maxDepth;
  }
  this->maxDepth = iVar3;
  __position._M_current =
       (this->path).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
       super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->path).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
      super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_8 = current;
    std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
    _M_realloc_insert<TIntermNode*const&>
              ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)&this->path,__position,
               &local_8);
  }
  else {
    *__position._M_current = current;
    pppTVar1 = &(this->path).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppTVar1 = *pppTVar1 + 1;
  }
  return;
}

Assistant:

void incrementDepth(TIntermNode *current)
    {
        depth++;
        maxDepth = (std::max)(maxDepth, depth);
        path.push_back(current);
    }